

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_operator_assignment_Test::TestBody
          (test_matrix_sparse_operator_assignment_Test *this)

{
  initializer_list<double> value;
  Scalar *pSVar1;
  char *pcVar2;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  AssertionResult gtest_ar;
  Matrix_Sparse matrix_0;
  Matrix_Sparse matrix_1;
  undefined1 local_178 [32];
  pointer local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  pointer local_148;
  pointer pdStack_140;
  pointer local_138;
  size_t sStack_130;
  undefined8 local_128;
  undefined1 local_118 [72];
  pointer local_d0;
  long local_c0;
  long local_b8;
  pointer local_90;
  Matrix_Sparse local_88;
  
  local_118._16_8_ = &DAT_00000005;
  local_118._24_8_ = &DAT_00000005;
  local_118._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_118._8_8_ = (pointer)0x2;
  local_118._32_8_ = (pointer)0x7;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  local_88.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_118._48_8_ = &local_158;
  local_138 = (pointer)0x4014000000000000;
  sStack_130 = 0x4018000000000000;
  local_148 = (pointer)&DAT_4008000000000000;
  pdStack_140 = (pointer)0x4010000000000000;
  local_158 = (pointer)0x3ff0000000000000;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4000000000000000;
  local_128 = 0x401c000000000000;
  local_118._56_8_ = (pointer)0x7;
  value._M_len = 7;
  value._M_array = (iterator)local_118._48_8_;
  non_zero._M_len = 5;
  non_zero._M_array = (iterator)local_118;
  index._M_len = 7;
  index._M_array = (iterator)&local_88;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)(local_118 + 0x40),non_zero,index,value,5);
  local_88.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.column_size = 0;
  local_88.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Disa::Matrix_Sparse::operator=(&local_88,(Matrix_Sparse *)(local_118 + 0x40));
  local_118._0_8_ = local_b8 - local_c0 >> 3;
  local_178._0_8_ =
       (long)local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_88.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_158,"matrix_0.size_non_zero()","matrix_1.size_non_zero()",
             (unsigned_long *)local_118,(unsigned_long *)local_178);
  if (local_158._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._0_8_ + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_178._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_88.row_non_zero.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_88.row_non_zero.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) + -1);
  if (local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_88.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_178._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
  local_118._0_8_ = ((long)local_d0 - local_118._64_8_ >> 3) + -1;
  if (local_d0 == (pointer)local_118._64_8_) {
    local_118._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
  local_118._8_8_ = local_90;
  local_178._8_8_ = local_88.column_size;
  testing::internal::
  CmpHelperEQ<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>>
            ((internal *)&local_158,"matrix_0.size()","matrix_1.size()",
             (pair<unsigned_long,_unsigned_long> *)local_118,
             (pair<unsigned_long,_unsigned_long> *)local_178);
  if (local_158._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_178,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._0_8_ + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_178._24_8_ = (pointer)0x0;
  if ((long)local_d0 - local_118._64_8_ != 8 && local_d0 != (pointer)local_118._64_8_) {
    do {
      local_178._16_8_ = (pointer)0x0;
      if (local_90 != (pointer)0x0) {
        do {
          Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_118,(size_t *)(local_118 + 0x40));
          pSVar1 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::
                   operator[]<Disa::Matrix_Sparse,_true>
                             ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_118,
                              (size_t *)(local_178 + 0x10));
          local_118._40_8_ = *pSVar1;
          Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_178,(size_t *)&local_88);
          pSVar1 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::
                   operator[]<Disa::Matrix_Sparse,_true>
                             ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_178,
                              (size_t *)(local_178 + 0x10));
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)&local_158,"matrix_0[i_row][i_column]","matrix_1[i_row][i_column]",
                     (double)local_118._40_8_,*pSVar1);
          if (local_158._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_118);
            pcVar2 = "";
            if (pbStack_150 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = (pbStack_150->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_178,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x47,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_178,(Message *)local_118);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_178);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_118._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_118._0_8_ + 8))();
            }
          }
          if (pbStack_150 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_150,pbStack_150);
          }
          local_178._16_8_ = local_178._16_8_ + 1;
        } while ((ulong)local_178._16_8_ < local_90);
      }
      local_178._24_8_ = local_178._24_8_ + 1;
    } while (((long)local_d0 - local_118._64_8_ != 0) &&
            ((ulong)local_178._24_8_ < (pointer)(((long)local_d0 - local_118._64_8_ >> 3) - 1U)));
  }
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_88);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)(local_118 + 0x40));
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_assignment) {
  Matrix_Sparse matrix_0({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  Matrix_Sparse matrix_1;
  matrix_1 = matrix_0;

  EXPECT_EQ(matrix_0.size_non_zero(), matrix_1.size_non_zero());
  EXPECT_EQ(matrix_0.size(), matrix_1.size());
  FOR(i_row, matrix_0.size_row())
  FOR(i_column, matrix_0.size_column()) {
    EXPECT_DOUBLE_EQ(matrix_0[i_row][i_column], matrix_1[i_row][i_column]);
  }
}